

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmYield(ExpressionContext *ctx,VmModule *module,ExprYield *node)

{
  VmFunction *pVVar1;
  VmBlock *block;
  VmModule *module_00;
  VmValue *pVVar2;
  VmBlock **ppVVar3;
  VmInstruction *value;
  VmValue *unaff_RBX;
  uint index;
  VmInstructionType in_R9D;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  pVVar1 = module->currentFunction;
  index = pVVar1->nextRestoreBlock + 1;
  pVVar1->nextRestoreBlock = index;
  ppVVar3 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar1->restoreBlocks,index);
  block = *ppVVar3;
  module_00 = (VmModule *)(node->super_ExprBase).source;
  if (node->value->type == ctx->typeVoid) {
    value = anon_unknown.dwarf_11cad6::CreateInstruction
                      ((anon_unknown_dwarf_11cad6 *)module,module_00,(SynBase *)0x0,
                       (VmType)(ZEXT816(0x21) << 0x40),in_R9D);
  }
  else {
    value = anon_unknown.dwarf_11cad6::CreateInstruction
                      ((anon_unknown_dwarf_11cad6 *)module,module_00,(SynBase *)0x0,
                       (VmType)(ZEXT816(0x21) << 0x40),(VmInstructionType)pVVar2,unaff_RBX);
  }
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  pVVar2 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,&value->super_VmValue);
  return pVVar2;
}

Assistant:

VmValue* CompileVmYield(ExpressionContext &ctx, VmModule *module, ExprYield *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	if(node->coroutineStateUpdate)
		CompileVm(ctx, module, node->coroutineStateUpdate);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *block = module->currentFunction->restoreBlocks[++module->currentFunction->nextRestoreBlock];

	VmValue *result = node->value->type == ctx.typeVoid ? CreateYield(module, node->source) : CreateYield(module, node->source, value);

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;

	return CheckType(ctx, node, result);
}